

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::BackUp(CopyingInputStreamAdaptor *this,int count)

{
  uchar *puVar1;
  LogMessage *pLVar2;
  LogFinisher local_e2;
  byte local_e1;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_14;
  CopyingInputStreamAdaptor *pCStack_10;
  int count_local;
  CopyingInputStreamAdaptor *this_local;
  
  local_51 = 0;
  local_14 = count;
  pCStack_10 = this;
  if ((this->backup_bytes_ != 0) ||
     (puVar1 = internal::scoped_array<unsigned_char>::get(&this->buffer_), puVar1 == (uchar *)0x0))
  {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x12d);
    local_51 = 1;
    pLVar2 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: backup_bytes_ == 0 && buffer_.get() != NULL: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," BackUp() can only be called after Next().");
    internal::LogFinisher::operator=(local_65,pLVar2);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  local_a1 = 0;
  if (this->buffer_used_ < local_14) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x12f);
    local_a1 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (count) <= (buffer_used_): ")
    ;
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,
                        " Can\'t back up over more bytes than were returned by the last call to Next()."
                       );
    internal::LogFinisher::operator=(&local_a2,pLVar2);
  }
  if ((local_a1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  local_e1 = 0;
  if (local_14 < 0) {
    internal::LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
               ,0x132);
    local_e1 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_e0,"CHECK failed: (count) >= (0): ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," Parameter to BackUp() can\'t be negative.");
    internal::LogFinisher::operator=(&local_e2,pLVar2);
  }
  if ((local_e1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_e0);
  }
  this->backup_bytes_ = local_14;
  return;
}

Assistant:

void CopyingInputStreamAdaptor::BackUp(int count) {
  GOOGLE_CHECK(backup_bytes_ == 0 && buffer_.get() != NULL)
    << " BackUp() can only be called after Next().";
  GOOGLE_CHECK_LE(count, buffer_used_)
    << " Can't back up over more bytes than were returned by the last call"
       " to Next().";
  GOOGLE_CHECK_GE(count, 0)
    << " Parameter to BackUp() can't be negative.";

  backup_bytes_ = count;
}